

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Swapchain.cpp
# Opt level: O3

Ptr<Swapchain> __thiscall myvk::Swapchain::Create(Swapchain *this,Ptr<Swapchain> *old_swapchain)

{
  element_type *peVar1;
  PFN_vkCreateSwapchainKHR p_Var2;
  PFN_vkGetSwapchainImagesKHR p_Var3;
  int iVar4;
  VkResult VVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  VkSwapchainCreateInfoKHR *pVVar8;
  _func_int **pp_Var9;
  byte bVar10;
  Ptr<Swapchain> PVar11;
  int height;
  int width;
  VkSurfaceCapabilitiesKHR capabilities;
  _func_int **local_78;
  element_type *peStack_70;
  uint local_5c;
  uint local_58;
  VkSurfaceCapabilitiesKHR local_54;
  
  bVar10 = 0;
  std::__shared_ptr<myvk::Swapchain,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<myvk::Swapchain>>
            ((__shared_ptr<myvk::Swapchain,(__gnu_cxx::_Lock_policy)2> *)&local_78,
             (allocator<myvk::Swapchain> *)&local_54);
  peVar1 = (old_swapchain->super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_78[3] = (_func_int *)
                (peVar1->m_graphics_queue_ptr).
                super___shared_ptr<myvk::Queue,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_78 + 4),
             &(peVar1->m_graphics_queue_ptr).
              super___shared_ptr<myvk::Queue,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  peVar1 = (old_swapchain->super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_78[5] = (_func_int *)
                (peVar1->m_present_queue_ptr).
                super___shared_ptr<myvk::PresentQueue,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_78 + 6),
             &(peVar1->m_present_queue_ptr).
              super___shared_ptr<myvk::PresentQueue,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  pVVar8 = &((old_swapchain->super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
            )->m_swapchain_create_info;
  pp_Var9 = local_78 + 8;
  for (lVar6 = 0xd; lVar6 != 0; lVar6 = lVar6 + -1) {
    *pp_Var9 = *(_func_int **)pVVar8;
    pVVar8 = (VkSwapchainCreateInfoKHR *)((long)pVVar8 + ((ulong)bVar10 * -2 + 1) * 8);
    pp_Var9 = pp_Var9 + (ulong)bVar10 * -2 + 1;
  }
  iVar4 = (*(((old_swapchain->super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr)->super_DeviceObjectBase).super_Base._vptr_Base[2])();
  (*vkGetPhysicalDeviceSurfaceCapabilitiesKHR)
            (*(VkPhysicalDevice *)(*(long *)(*(long *)CONCAT44(extraout_var,iVar4) + 0x18) + 0x28),
             *(VkSurfaceKHR *)(*(long *)(local_78[5] + 0x28) + 0x30),&local_54);
  if (local_54.currentExtent.width == 0xffffffff) {
    glfwGetWindowSize(*(GLFWwindow **)(*(long *)(local_78[5] + 0x28) + 0x28),(int *)&local_58,
                      (int *)&local_5c);
    local_54.currentExtent.width = local_54.maxImageExtent.width;
    if (local_58 < local_54.maxImageExtent.width) {
      local_54.currentExtent.width = local_58;
    }
    if (local_54.currentExtent.width < local_54.minImageExtent.width) {
      local_54.currentExtent.width = local_54.minImageExtent.width;
    }
    if (local_5c < local_54.maxImageExtent.height) {
      local_54.maxImageExtent.height = local_5c;
    }
    local_54.currentExtent.height = local_54.maxImageExtent.height;
    if (local_54.maxImageExtent.height < local_54.minImageExtent.height) {
      local_54.currentExtent.height = local_54.minImageExtent.height;
    }
  }
  pp_Var9 = local_78;
  *(undefined4 *)(local_78 + 8) = 0x3b9acde8;
  *(uint32_t *)((long)local_78 + 0x6c) = local_54.currentExtent.width;
  *(uint32_t *)(local_78 + 0xe) = local_54.currentExtent.height;
  peVar1 = (old_swapchain->super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_78[0x14] = (_func_int *)peVar1->m_swapchain;
  p_Var2 = vkCreateSwapchainKHR;
  iVar4 = (*(peVar1->super_DeviceObjectBase).super_Base._vptr_Base[2])();
  VVar5 = (*p_Var2)(*(VkDevice *)(*(long *)CONCAT44(extraout_var_00,iVar4) + 0x268),
                    (VkSwapchainCreateInfoKHR *)(pp_Var9 + 8),(VkAllocationCallbacks *)0x0,
                    (VkSwapchainKHR *)(local_78 + 7));
  p_Var3 = vkGetSwapchainImagesKHR;
  if (VVar5 == VK_SUCCESS) {
    iVar4 = (*(((old_swapchain->super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr)->super_DeviceObjectBase).super_Base._vptr_Base[2])();
    (*p_Var3)(*(VkDevice *)(*(long *)CONCAT44(extraout_var_01,iVar4) + 0x268),
              (VkSwapchainKHR)local_78[7],(uint32_t *)(local_78 + 0x15),(VkImage *)0x0);
    (this->super_DeviceObjectBase).super_Base._vptr_Base = local_78;
    (this->super_DeviceObjectBase).super_Base.super_enable_shared_from_this<myvk::Base>._M_weak_this
    .super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peStack_70;
    _Var7._M_pi = extraout_RDX_01;
  }
  else {
    (this->super_DeviceObjectBase).super_Base._vptr_Base = (_func_int **)0x0;
    (this->super_DeviceObjectBase).super_Base.super_enable_shared_from_this<myvk::Base>._M_weak_this
    .super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    _Var7._M_pi = extraout_RDX;
    if (peStack_70 != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peStack_70);
      _Var7._M_pi = extraout_RDX_00;
    }
  }
  PVar11.super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var7._M_pi;
  PVar11.super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (Ptr<Swapchain>)PVar11.super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Ptr<Swapchain> Swapchain::Create(const Ptr<Swapchain> &old_swapchain) {
	auto ret = std::make_shared<Swapchain>();
	ret->m_graphics_queue_ptr = old_swapchain->m_graphics_queue_ptr;
	ret->m_present_queue_ptr = old_swapchain->m_present_queue_ptr;
	ret->m_swapchain_create_info = old_swapchain->m_swapchain_create_info;

	VkPhysicalDevice physical_device = old_swapchain->GetDevicePtr()->GetPhysicalDevicePtr()->GetHandle();

	VkSurfaceCapabilitiesKHR capabilities;
	vkGetPhysicalDeviceSurfaceCapabilitiesKHR(physical_device, ret->m_present_queue_ptr->GetSurfacePtr()->GetHandle(),
	                                          &capabilities);

	// query extent
	VkExtent2D extent = capabilities.currentExtent;
	if (capabilities.currentExtent.width == UINT32_MAX) {
		int width, height;
		glfwGetWindowSize(ret->m_present_queue_ptr->GetSurfacePtr()->GetGlfwWindow(), &width, &height);
		extent = {(uint32_t)width, (uint32_t)height};

		extent.width =
		    std::max(capabilities.minImageExtent.width, std::min(capabilities.maxImageExtent.width, extent.width));
		extent.height =
		    std::max(capabilities.minImageExtent.height, std::min(capabilities.maxImageExtent.height, extent.height));
	}

	// create swapchain
	VkSwapchainCreateInfoKHR &create_info = ret->m_swapchain_create_info;
	create_info.sType = VK_STRUCTURE_TYPE_SWAPCHAIN_CREATE_INFO_KHR;
	create_info.imageExtent = extent;
	create_info.oldSwapchain = old_swapchain->GetHandle();

	if (vkCreateSwapchainKHR(old_swapchain->GetDevicePtr()->GetHandle(), &create_info, nullptr, &ret->m_swapchain) !=
	    VK_SUCCESS)
		return nullptr;

	// get image count
	vkGetSwapchainImagesKHR(old_swapchain->GetDevicePtr()->GetHandle(), ret->m_swapchain, &ret->m_image_count, nullptr);

	return ret;
}